

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeMapRef.h
# Opt level: O0

bool __thiscall
GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_ConcatenatedWrite
          (CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *this,
          CNodeWriteConcatenator *pConcatenatedWrite,bool featureStreaming,
          gcstring_vector *pErrorList)

{
  byte bVar1;
  ExceptionReporter<GenICam_3_4::AccessException> *this_00;
  undefined8 in_RCX;
  byte in_DL;
  undefined8 in_RSI;
  long in_RDI;
  undefined3 in_stack_ffffffffffffff28;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff34;
  char *in_stack_ffffffffffffff38;
  ExceptionReporter<GenICam_3_4::AccessException> *in_stack_ffffffffffffff40;
  
  if (*(long *)(in_RDI + 8) != 0) {
    bVar1 = (**(code **)(**(long **)(in_RDI + 8) + 0x68))
                      (*(long **)(in_RDI + 8),in_RSI,in_DL & 1,in_RCX);
    return (bool)(bVar1 & 1);
  }
  uVar2 = CONCAT13(1,in_stack_ffffffffffffff28);
  this_00 = (ExceptionReporter<GenICam_3_4::AccessException> *)__cxa_allocate_exception(0x1f0);
  GenICam_3_4::ExceptionReporter<GenICam_3_4::AccessException>::ExceptionReporter
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
             (char *)CONCAT44(in_stack_ffffffffffffff2c,uVar2));
  GenICam_3_4::ExceptionReporter<GenICam_3_4::AccessException>::Report
            (this_00,&stack0xffffffffffffff38,"Feature not present (reference not valid)");
  __cxa_throw(this_00,&GenICam_3_4::AccessException::typeinfo,
              GenICam_3_4::AccessException::~AccessException);
}

Assistant:

inline bool CNodeMapRefT<TCameraParams>::_ConcatenatedWrite(CNodeWriteConcatenator* pConcatenatedWrite, bool featureStreaming, GENICAM_NAMESPACE::gcstring_vector* pErrorList)
    {
        if (_Ptr)
            return _Ptr->ConcatenatedWrite(pConcatenatedWrite, featureStreaming, pErrorList);
        throw ACCESS_EXCEPTION("Feature not present (reference not valid)");
    }